

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O3

tVertex __thiscall MeshLib::Solid::createVertex(Solid *this,int id)

{
  int *piVar1;
  Vertex *inData;
  Node<MeshLib::Vertex> *pNVar2;
  
  inData = (Vertex *)operator_new(0xc0);
  (inData->m_laplacian).v[0] = 0.0;
  (inData->m_laplacian).v[1] = 0.0;
  (inData->m_laplacian).v[2] = 0.0;
  inData->m_halfedge = (HalfEdge *)0x0;
  (inData->m_point).v[0] = 0.0;
  (inData->m_point).v[1] = 0.0;
  (inData->m_point).v[2] = 0.0;
  (inData->m_normal).v[0] = 0.0;
  (inData->m_normal).v[1] = 0.0;
  (inData->m_normal).v[2] = 0.0;
  (inData->m_string)._M_dataplus._M_p = (pointer)&(inData->m_string).field_2;
  (inData->m_string)._M_string_length = 0;
  (inData->m_string).field_2._M_local_buf[0] = '\0';
  (inData->m_gradient).v[0] = 0.0;
  (inData->m_gradient).v[1] = 0.0;
  (inData->m_gradient).v[2] = 0.0;
  inData->m_boundary = false;
  inData->m_trait = (Trait *)0x0;
  inData->m_id = id;
  pNVar2 = AVL::Node<MeshLib::Vertex>::insert_node((this->m_verts).root,inData);
  (this->m_verts).root = pNVar2;
  piVar1 = &(this->m_verts).size;
  *piVar1 = *piVar1 + 1;
  return inData;
}

Assistant:

Solid::tVertex Solid::createVertex( int id )
{
	tVertex v = new Vertex();
	
	v->id() = id;
	m_verts.insert( v );
	return v;//insert a new vertex, with id as the key
}